

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

void __thiscall dns::Message::removeAllRecords(Message *this)

{
  QuerySection *pQVar1;
  ResourceRecord *pRVar2;
  bool bVar3;
  reference ppQVar4;
  reference ppRVar5;
  iterator it_3;
  iterator it_2;
  iterator it_1;
  iterator it;
  vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *in_stack_ffffffffffffff88;
  ResourceRecord *in_stack_ffffffffffffff90;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_40;
  ResourceRecord **local_38;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_30;
  ResourceRecord **local_28;
  __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
  local_20;
  QuerySection **local_18;
  __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
  local_10 [2];
  
  local_10[0]._M_current =
       (QuerySection **)
       std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::begin
                 (in_stack_ffffffffffffff88);
  while( true ) {
    local_18 = (QuerySection **)
               std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::end
                         (in_stack_ffffffffffffff88);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar3) break;
    ppQVar4 = __gnu_cxx::
              __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
              ::operator*(local_10);
    pQVar1 = *ppQVar4;
    if (pQVar1 != (QuerySection *)0x0) {
      QuerySection::~QuerySection((QuerySection *)0x11845b);
      operator_delete(pQVar1,0x28);
    }
    __gnu_cxx::
    __normal_iterator<dns::QuerySection_**,_std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>_>
    ::operator++(local_10);
  }
  std::vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>::clear
            ((vector<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_> *)0x118486);
  local_20._M_current =
       (ResourceRecord **)
       std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                 ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                  in_stack_ffffffffffffff88);
  while( true ) {
    local_28 = (ResourceRecord **)
               std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                         ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                          in_stack_ffffffffffffff88);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar3) break;
    ppRVar5 = __gnu_cxx::
              __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
              ::operator*(&local_20);
    pRVar2 = *ppRVar5;
    if (pRVar2 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(in_stack_ffffffffffffff90);
      operator_delete(pRVar2,0x38);
    }
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator++(&local_20);
  }
  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::clear
            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)0x11850e);
  local_30._M_current =
       (ResourceRecord **)
       std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                 ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                  in_stack_ffffffffffffff88);
  while( true ) {
    local_38 = (ResourceRecord **)
               std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
                         ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                          in_stack_ffffffffffffff88);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar3) break;
    ppRVar5 = __gnu_cxx::
              __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
              ::operator*(&local_30);
    pRVar2 = *ppRVar5;
    if (pRVar2 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(in_stack_ffffffffffffff90);
      operator_delete(pRVar2,0x38);
    }
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator++(&local_30);
  }
  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::clear
            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)0x118596);
  local_40._M_current =
       (ResourceRecord **)
       std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::begin
                 ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
                  in_stack_ffffffffffffff88);
  while( true ) {
    std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::end
              ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)
               in_stack_ffffffffffffff88);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar3) break;
    ppRVar5 = __gnu_cxx::
              __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffff90 = *ppRVar5;
    if (in_stack_ffffffffffffff90 != (ResourceRecord *)0x0) {
      ResourceRecord::~ResourceRecord(in_stack_ffffffffffffff90);
      operator_delete(in_stack_ffffffffffffff90,0x38);
    }
    __gnu_cxx::
    __normal_iterator<dns::ResourceRecord_**,_std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>_>
    ::operator++(&local_40);
  }
  std::vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>::clear
            ((vector<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_> *)0x11861e);
  return;
}

Assistant:

void Message::removeAllRecords()
{
    // delete all queries
    for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
        delete(*it);
    mQueries.clear();
     
    // delete answers 
    for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
        delete(*it);
    mAnswers.clear();

    // delete authorities
    for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
        delete(*it);
    mAuthorities.clear();

    // delete additional 
    for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
        delete(*it);
    mAdditional.clear();
}